

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AY38910.hpp
# Opt level: O1

void __thiscall GI::AY38910::State::State(State *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string local_30;
  
  (this->super_StructImpl<GI::AY38910::State>).super_Struct._vptr_Struct =
       (_func_int **)&PTR_all_keys_abi_cxx11__005ab1d0;
  this->registers[0] = '\0';
  this->registers[1] = '\0';
  this->registers[2] = '\0';
  this->registers[3] = '\0';
  this->registers[4] = '\0';
  this->registers[5] = '\0';
  this->registers[6] = '\0';
  this->registers[7] = '\0';
  this->registers[8] = '\0';
  this->registers[9] = '\0';
  this->registers[10] = '\0';
  this->registers[0xb] = '\0';
  this->registers[0xc] = '\0';
  this->registers[0xd] = '\0';
  this->registers[0xe] = '\0';
  this->registers[0xf] = '\0';
  this->selected_register = '\0';
  if (Reflection::StructImpl<GI::AY38910::State>::contents__abi_cxx11_._M_h._M_element_count == 0) {
    paVar1 = &local_30.field_2;
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"registers","");
    Reflection::StructImpl<GI::AY38910::State>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<GI::AY38910::State>,this->registers,&local_30,0x10);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
    local_30._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"selected_register","");
    Reflection::StructImpl<GI::AY38910::State>::declare_emplace<unsigned_char>
              (&this->super_StructImpl<GI::AY38910::State>,&this->selected_register,&local_30,1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != paVar1) {
      operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

State() {
		if(needs_declare()) {
			DeclareField(registers);
			DeclareField(selected_register);
		}
	}